

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::PolyNode::AddChild(PolyNode *this,PolyNode *child)

{
  pointer ppPVar1;
  pointer ppPVar2;
  PolyNode *local_20;
  
  ppPVar1 = (this->Childs).
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppPVar2 = (this->Childs).
            super__Vector_base<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_20 = child;
  std::vector<ClipperLib::PolyNode*,std::allocator<ClipperLib::PolyNode*>>::
  emplace_back<ClipperLib::PolyNode*>
            ((vector<ClipperLib::PolyNode*,std::allocator<ClipperLib::PolyNode*>> *)&this->Childs,
             &local_20);
  child->Parent = this;
  child->Index = (uint)((ulong)((long)ppPVar1 - (long)ppPVar2) >> 3);
  return;
}

Assistant:

void PolyNode::AddChild(PolyNode& child)
{
  unsigned cnt = (unsigned)Childs.size();
  Childs.push_back(&child);
  child.Parent = this;
  child.Index = cnt;
}